

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O2

span<char> __thiscall libtorrent::aux::receive_buffer::reserve(receive_buffer *this,int size)

{
  int iVar1;
  int iVar2;
  span<char> sVar3;
  span<const_char> initialize;
  buffer new_buffer;
  buffer local_30;
  
  iVar2 = this->m_recv_end;
  iVar1 = iVar2 + size;
  if ((int)(this->m_recv_buffer).m_size < iVar1) {
    initialize.m_len = (long)iVar2;
    iVar2 = this->m_packet_size;
    if (this->m_packet_size < iVar1) {
      iVar2 = iVar1;
    }
    initialize.m_ptr = (this->m_recv_buffer).m_begin;
    aux::buffer::buffer(&local_30,(long)iVar2,initialize);
    aux::buffer::operator=(&this->m_recv_buffer,&local_30);
    (this->m_watermark).m_mean = 0;
    (this->m_watermark).m_average_deviation = 0;
    (this->m_watermark).m_num_samples = 0;
    free(local_30.m_begin);
    iVar2 = this->m_recv_end;
  }
  sVar3.m_len = (long)size;
  sVar3.m_ptr = (this->m_recv_buffer).m_begin + iVar2;
  return sVar3;
}

Assistant:

span<char> receive_buffer::reserve(int const size)
{
	INVARIANT_CHECK;
	TORRENT_ASSERT(size > 0);
	TORRENT_ASSERT(m_recv_pos >= 0);

	// normalize() must be called before receiving more data
	TORRENT_ASSERT(m_recv_start == 0);

	if (int(m_recv_buffer.size()) < m_recv_end + size)
	{
		int const new_size = std::max(m_recv_end + size, m_packet_size);
		buffer new_buffer(new_size, {m_recv_buffer.data(), m_recv_end});
		m_recv_buffer = std::move(new_buffer);

		// since we just increased the size of the buffer, reset the watermark to
		// start at our new size (avoid flapping the buffer size)
		m_watermark = {};
	}

	return span<char>(m_recv_buffer).subspan(m_recv_end, size);
}